

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(ModelDescription *a,ModelDescription *b)

{
  bool bVar1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar3;
  string *psVar4;
  string *psVar5;
  Metadata *a_00;
  Metadata *b_00;
  ModelDescription *b_local;
  ModelDescription *a_local;
  
  pRVar2 = ModelDescription::input(a);
  pRVar3 = ModelDescription::input(b);
  bVar1 = operator!=(pRVar2,pRVar3);
  if (bVar1) {
    a_local._7_1_ = false;
  }
  else {
    pRVar2 = ModelDescription::output(a);
    pRVar3 = ModelDescription::output(b);
    bVar1 = operator!=(pRVar2,pRVar3);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      psVar4 = ModelDescription::predictedfeaturename_abi_cxx11_(a);
      psVar5 = ModelDescription::predictedfeaturename_abi_cxx11_(b);
      bVar1 = std::operator!=(psVar4,psVar5);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else {
        psVar4 = ModelDescription::predictedprobabilitiesname_abi_cxx11_(a);
        psVar5 = ModelDescription::predictedprobabilitiesname_abi_cxx11_(b);
        bVar1 = std::operator!=(psVar4,psVar5);
        if (bVar1) {
          a_local._7_1_ = false;
        }
        else {
          a_00 = ModelDescription::metadata(a);
          b_00 = ModelDescription::metadata(b);
          bVar1 = operator!=(a_00,b_00);
          if (bVar1) {
            a_local._7_1_ = false;
          }
          else {
            a_local._7_1_ = true;
          }
        }
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const ModelDescription& a,
                        const ModelDescription& b) {
            if (a.input() != b.input()) {
                return false;
            }
            if (a.output() != b.output()) {
                return false;
            }
            if (a.predictedfeaturename() != b.predictedfeaturename()) {
                return false;
            }
            if (a.predictedprobabilitiesname() != b.predictedprobabilitiesname()) {
                return false;
            }
            if (a.metadata() != b.metadata()) {
                return false;
            }
            return true;
        }